

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from,CopyFn copy_fn)

{
  Arena *pAVar1;
  int iVar2;
  int iVar3;
  Nullable<const_char_*> failure_msg;
  void **ppvVar4;
  void **ppvVar5;
  void *pvVar6;
  Rep *pRVar7;
  int n;
  void **ppvVar8;
  LogMessageFatal local_48;
  RepeatedPtrFieldBase *local_38;
  
  local_48.super_LogMessage._0_8_ = from;
  local_38 = this;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::internal::RepeatedPtrFieldBase_const*,google::protobuf::internal::RepeatedPtrFieldBase*>
                          ((RepeatedPtrFieldBase **)&local_48,&local_38,"&from != this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0xbf,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_48);
  }
  n = from->current_size_ + this->current_size_;
  ppvVar4 = InternalReserve(this,n);
  ppvVar5 = elements(from);
  iVar3 = from->current_size_;
  iVar2 = ClearedCount(this);
  ppvVar8 = ppvVar5;
  if (0 < iVar2) {
    iVar2 = MergeIntoClearedMessages(this,from);
    ppvVar4 = ppvVar4 + iVar2;
    ppvVar8 = ppvVar5 + iVar2;
  }
  pAVar1 = this->arena_;
  if (0 < from->current_size_) {
    for (; ppvVar8 < ppvVar5 + iVar3 + -1; ppvVar8 = ppvVar8 + 1) {
      pvVar6 = (*copy_fn)(pAVar1,*ppvVar8);
      *ppvVar4 = pvVar6;
      ppvVar4 = ppvVar4 + 1;
    }
  }
  for (; ppvVar8 < ppvVar5 + iVar3; ppvVar8 = ppvVar8 + 1) {
    pvVar6 = (*copy_fn)(pAVar1,*ppvVar8);
    *ppvVar4 = pvVar6;
    ppvVar4 = ppvVar4 + 1;
  }
  this->current_size_ = n;
  iVar3 = allocated_size(this);
  if (iVar3 < n) {
    pRVar7 = rep(this);
    pRVar7->allocated_size = n;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromConcreteMessage(
    const RepeatedPtrFieldBase& from, CopyFn copy_fn) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  void** dst = InternalReserve(new_size);
  const void* const* src = from.elements();
  auto end = src + from.current_size_;
  constexpr ptrdiff_t kPrefetchstride = 1;
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  if (from.current_size_ >= kPrefetchstride) {
    auto prefetch_end = end - kPrefetchstride;
    for (; src < prefetch_end; ++src, ++dst) {
      auto next = src + kPrefetchstride;
      absl::PrefetchToLocalCache(*next);
      *dst = copy_fn(arena, *src);
    }
  }
  for (; src < end; ++src, ++dst) {
    *dst = copy_fn(arena, *src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}